

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int pigpioOpenSocket(char *addr,char *port)

{
  int iVar1;
  size_t sVar2;
  char *in_RSI;
  char *in_RDI;
  char *portStr;
  char *addrStr;
  addrinfo *rp;
  addrinfo *res;
  addrinfo hints;
  int opt;
  int err;
  int sock;
  char *local_78;
  char *local_70;
  addrinfo *local_68;
  addrinfo *local_60;
  addrinfo local_58;
  undefined4 local_24;
  undefined4 local_20;
  int local_1c;
  char *local_18;
  int local_4;
  
  local_70 = in_RDI;
  local_18 = in_RSI;
  if ((in_RDI == (char *)0x0) &&
     ((local_70 = getenv("PIGPIO_ADDR"), local_70 == (char *)0x0 ||
      (sVar2 = strlen(local_70), sVar2 == 0)))) {
    local_70 = "127.0.0.1";
  }
  if (local_18 == (char *)0x0) {
    local_78 = getenv("PIGPIO_PORT");
    if ((local_78 == (char *)0x0) || (sVar2 = strlen(local_78), sVar2 == 0)) {
      local_78 = "8888";
    }
  }
  else {
    local_78 = local_18;
  }
  memset(&local_58,0,0x30);
  local_58.ai_family = 0;
  local_58.ai_socktype = 1;
  local_58.ai_flags = local_58.ai_flags | 2;
  iVar1 = getaddrinfo(local_70,local_78,&local_58,&local_60);
  if (iVar1 == 0) {
    local_20 = 0;
    for (local_68 = local_60; local_68 != (addrinfo *)0x0; local_68 = local_68->ai_next) {
      local_1c = socket(local_68->ai_family,local_68->ai_socktype,local_68->ai_protocol);
      if (local_1c != -1) {
        local_24 = 1;
        setsockopt(local_1c,6,1,&local_24,4);
        iVar1 = connect(local_1c,local_68->ai_addr,local_68->ai_addrlen);
        if (iVar1 != -1) break;
      }
    }
    freeaddrinfo(local_60);
    if (local_68 == (addrinfo *)0x0) {
      local_4 = -0x7d3;
    }
    else {
      local_4 = local_1c;
    }
  }
  else {
    local_4 = -0x7d2;
  }
  return local_4;
}

Assistant:

static int pigpioOpenSocket(char *addr, char *port)
{
   int sock, err, opt;
   struct addrinfo hints, *res, *rp;
   const char *addrStr, *portStr;

   if (!addr)
   {
      addrStr = getenv(PI_ENVADDR);

      if ((!addrStr) || (!strlen(addrStr)))
      {
         addrStr = PI_DEFAULT_SOCKET_ADDR_STR;
      }
   }
   else addrStr = addr;

   if (!port)
   {
      portStr = getenv(PI_ENVPORT);

      if ((!portStr) || (!strlen(portStr)))
      {
         portStr = PI_DEFAULT_SOCKET_PORT_STR;
      }
   }
   else portStr = port;

   memset (&hints, 0, sizeof (hints));

   hints.ai_family   = PF_UNSPEC;
   hints.ai_socktype = SOCK_STREAM;
   hints.ai_flags   |= AI_CANONNAME;

   err = getaddrinfo (addrStr, portStr, &hints, &res);

   if (err) return pigif_bad_getaddrinfo;

   for (rp=res; rp!=NULL; rp=rp->ai_next)
   {
      sock = socket(rp->ai_family, rp->ai_socktype, rp->ai_protocol);

      if (sock == -1) continue;

      /* Disable the Nagle algorithm. */
      opt = 1;
      setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char*)&opt, sizeof(int));

      if (connect(sock, rp->ai_addr, rp->ai_addrlen) != -1) break;
   }

   freeaddrinfo(res);

   if (rp == NULL) return pigif_bad_connect;

   return sock;
}